

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

bool __thiscall QFSFileEnginePrivate::flushFh(QFSFileEnginePrivate *this)

{
  int errorCode;
  QAbstractFileEngine *this_00;
  int iVar1;
  int *piVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->lastFlushFailed == false) {
    this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
    iVar1 = fflush((FILE *)this->fh);
    this->lastIOCommand = IOFlushCommand;
    this->lastFlushFailed = iVar1 != 0;
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      errorCode = *piVar2;
      QSystemError::stdString((QString *)&local_40,errorCode);
      QAbstractFileEngine::setError
                (this_00,(uint)(errorCode == 0x1c) * 2 + WriteError,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    }
    bVar3 = iVar1 == 0;
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEnginePrivate::flushFh()
{
    Q_Q(QFSFileEngine);

    // Never try to flush again if the last flush failed. Otherwise you can
    // get crashes on some systems (AIX).
    if (lastFlushFailed)
        return false;

    int ret = fflush(fh);

    lastFlushFailed = (ret != 0);
    lastIOCommand = QFSFileEnginePrivate::IOFlushCommand;

    if (ret != 0) {
        q->setError(errno == ENOSPC ? QFile::ResourceError : QFile::WriteError,
                    QSystemError::stdString(errno));
        return false;
    }
    return true;
}